

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ConstTestT<short>(void)

{
  if (ConstTestT<short>()::t == '\0') {
    ConstTestT<short>();
  }
  if (ConstTestT<short>()::b == '\0') {
    ConstTestT<short>();
  }
  return;
}

Assistant:

void ConstTestT()
	{
		static const T t = ConstConstructor<T>();
		static const bool b = ConstBool<T>();
	}